

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geo_parquet.cpp
# Opt level: O3

void __thiscall
duckdb::GeoParquetFileMetadata::Write(GeoParquetFileMetadata *this,FileMetaData *file_meta_data)

{
  yyjson_val_pool *pyVar1;
  yyjson_str_pool *pyVar2;
  yyjson_alc *alc;
  _FileMetaData__isset *p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  yyjson_val_uni yVar5;
  pointer pcVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  _Hash_node_base *__s;
  _func_void_void_ptr_void_ptr *p_Var10;
  void *pvVar11;
  FileMetaData *pFVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  yyjson_mut_doc *doc;
  size_t sVar16;
  char *pcVar17;
  _Rb_tree_node_base *p_Var18;
  yyjson_doc *pyVar19;
  yyjson_mut_val *pyVar20;
  InvalidInputException *this_00;
  SerializationException *this_01;
  yyjson_mut_val *pyVar21;
  yyjson_mut_val *pyVar22;
  yyjson_mut_val *pyVar23;
  _Hash_node_base *p_Var24;
  yyjson_mut_val *local_108;
  string local_c8;
  FileMetaData *local_a8;
  yyjson_mut_val *local_a0;
  size_t len;
  KeyValue kv;
  yyjson_write_err err;
  
  pyVar20 = (yyjson_mut_val *)0x0;
  local_a8 = file_meta_data;
  doc = duckdb_yyjson::yyjson_mut_doc_new((yyjson_alc *)0x0);
  if (doc == (yyjson_mut_doc *)0x0) {
    bVar15 = false;
    goto LAB_00cd63fa;
  }
  pyVar1 = &doc->val_pool;
  pyVar23 = (doc->val_pool).cur;
  if ((doc->val_pool).end == pyVar23) {
    bVar15 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
    if (bVar15) {
      pyVar23 = pyVar1->cur;
      goto LAB_00cd60dc;
    }
    pyVar23 = (yyjson_mut_val *)0x0;
  }
  else {
LAB_00cd60dc:
    pyVar1->cur = pyVar23 + 1;
    if (pyVar23 == (yyjson_mut_val *)0x0) {
      pyVar23 = (yyjson_mut_val *)0x0;
    }
    else {
      pyVar23->tag = 7;
    }
  }
  doc->root = pyVar23;
  pcVar6 = (this->version)._M_dataplus._M_p;
  if (((pcVar6 != (pointer)0x0) && (pyVar23 != (yyjson_mut_val *)0x0)) &&
     ((~(uint)pyVar23->tag & 7) == 0)) {
    uVar7 = (this->version)._M_string_length;
    pyVar20 = (doc->val_pool).cur;
    if ((ulong)(((long)(doc->val_pool).end - (long)pyVar20) / 0x18) < 2) {
      bVar15 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
      if (!bVar15) goto LAB_00cd6214;
      pyVar20 = pyVar1->cur;
    }
    pyVar1->cur = pyVar20 + 2;
    if (pyVar20 != (yyjson_mut_val *)0x0) {
      uVar8 = pyVar23->tag;
      pyVar20->tag = 0x70d;
      (pyVar20->uni).str = "version";
      pyVar2 = &doc->str_pool;
      pcVar17 = (doc->str_pool).cur;
      if (uVar7 < (ulong)((long)(doc->str_pool).end - (long)pcVar17)) {
LAB_00cd6188:
        pyVar2->cur = pcVar17 + uVar7 + 1;
        if (pcVar17 != (char *)0x0) {
          switchD_015de399::default(pcVar17,pcVar6,uVar7);
          pcVar17[uVar7] = '\0';
          pyVar20[1].uni.ptr = pcVar17;
          pyVar20[1].tag = uVar7 << 8 | 5;
          pyVar22 = pyVar20;
          if (0xff < uVar8) {
            lVar9 = *(long *)((pyVar23->uni).u64 + 0x10);
            pyVar22 = *(yyjson_mut_val **)(lVar9 + 0x10);
            *(yyjson_mut_val **)(lVar9 + 0x10) = pyVar20;
          }
          pyVar20[1].next = pyVar22;
          pyVar20->next = pyVar20 + 1;
          (pyVar23->uni).u64 = (uint64_t)pyVar20;
          pyVar23->tag = (ulong)(byte)pyVar23->tag + (uVar8 & 0xffffffffffffff00) + 0x100;
          goto LAB_00cd6214;
        }
      }
      else {
        bVar15 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pyVar2,&doc->alc,uVar7 + 1);
        if (bVar15) {
          pcVar17 = pyVar2->cur;
          goto LAB_00cd6188;
        }
      }
      pyVar20[1].uni.u64 = 0;
    }
  }
LAB_00cd6214:
  pcVar6 = (this->primary_geometry_column)._M_dataplus._M_p;
  if (pcVar6 == (pointer)0x0) {
    if (doc != (yyjson_mut_doc *)0x0) goto LAB_00cd632f;
LAB_00cd709b:
    pyVar22 = (yyjson_mut_val *)0x0;
    bVar15 = false;
LAB_00cd70a6:
    pyVar20 = (yyjson_mut_val *)0x0;
  }
  else {
    if (doc == (yyjson_mut_doc *)0x0) goto LAB_00cd709b;
    if (pyVar23 == (yyjson_mut_val *)0x0) {
      pyVar23 = (yyjson_mut_val *)0x0;
    }
    else if ((~(uint)pyVar23->tag & 7) == 0) {
      uVar7 = (this->primary_geometry_column)._M_string_length;
      pyVar20 = (doc->val_pool).cur;
      if ((ulong)(((long)(doc->val_pool).end - (long)pyVar20) / 0x18) < 2) {
        bVar15 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,2);
        if (!bVar15) goto LAB_00cd632f;
        pyVar20 = pyVar1->cur;
      }
      pyVar1->cur = pyVar20 + 2;
      if (pyVar20 != (yyjson_mut_val *)0x0) {
        uVar8 = pyVar23->tag;
        pyVar20->tag = 0xe0d;
        (pyVar20->uni).str = "primary_column";
        pyVar2 = &doc->str_pool;
        pcVar17 = (doc->str_pool).cur;
        if (uVar7 < (ulong)((long)(doc->str_pool).end - (long)pcVar17)) {
LAB_00cd62a3:
          pyVar2->cur = pcVar17 + uVar7 + 1;
          if (pcVar17 != (char *)0x0) {
            switchD_015de399::default(pcVar17,pcVar6,uVar7);
            pcVar17[uVar7] = '\0';
            pyVar20[1].uni.ptr = pcVar17;
            pyVar20[1].tag = uVar7 << 8 | 5;
            pyVar22 = pyVar20;
            if (0xff < uVar8) {
              lVar9 = *(long *)((pyVar23->uni).u64 + 0x10);
              pyVar22 = *(yyjson_mut_val **)(lVar9 + 0x10);
              *(yyjson_mut_val **)(lVar9 + 0x10) = pyVar20;
            }
            pyVar20[1].next = pyVar22;
            pyVar20->next = pyVar20 + 1;
            (pyVar23->uni).u64 = (uint64_t)pyVar20;
            pyVar23->tag = (ulong)(byte)pyVar23->tag + (uVar8 & 0xffffffffffffff00) + 0x100;
            goto LAB_00cd632f;
          }
        }
        else {
          bVar15 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pyVar2,&doc->alc,uVar7 + 1);
          if (bVar15) {
            pcVar17 = pyVar2->cur;
            goto LAB_00cd62a3;
          }
        }
        pyVar20[1].uni.u64 = 0;
      }
    }
LAB_00cd632f:
    pyVar20 = (doc->val_pool).cur;
    if ((doc->val_pool).end == pyVar20) {
      bVar15 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      pyVar20 = (doc->val_pool).cur;
      if (bVar15) goto LAB_00cd633d;
      pyVar22 = (yyjson_mut_val *)0x0;
    }
    else {
LAB_00cd633d:
      pyVar1->cur = pyVar20 + 1;
      if (pyVar20 == (yyjson_mut_val *)0x0) {
        pyVar22 = (yyjson_mut_val *)0x0;
        pyVar20 = pyVar20 + 1;
      }
      else {
        pyVar20->tag = 0x70d;
        (pyVar20->uni).f64 = (double)"columns";
        pyVar22 = pyVar20;
        pyVar20 = pyVar1->cur;
      }
    }
    if ((doc->val_pool).end == pyVar20) {
      bVar15 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,&doc->alc,1);
      if (bVar15) {
        pyVar20 = pyVar1->cur;
        goto LAB_00cd636c;
      }
      bVar15 = true;
      goto LAB_00cd70a6;
    }
LAB_00cd636c:
    pyVar1->cur = pyVar20 + 1;
    bVar15 = true;
    if (pyVar20 == (yyjson_mut_val *)0x0) goto LAB_00cd70a6;
    pyVar20->tag = 7;
  }
  if (((pyVar23 == (yyjson_mut_val *)0x0) || (pyVar22 == (yyjson_mut_val *)0x0)) ||
     ((uVar7 = pyVar23->tag, ((uint)uVar7 & 7) != 7 ||
      ((pyVar20 == (yyjson_mut_val *)0x0 || (((uint)pyVar22->tag & 7) != 5)))))) {
    pyVar20 = (yyjson_mut_val *)0x0;
  }
  else {
    pyVar21 = pyVar22;
    if (0xff < uVar7) {
      lVar9 = *(long *)((pyVar23->uni).u64 + 0x10);
      pyVar21 = *(yyjson_mut_val **)(lVar9 + 0x10);
      *(yyjson_mut_val **)(lVar9 + 0x10) = pyVar22;
    }
    pyVar20->next = pyVar21;
    pyVar22->next = pyVar20;
    (pyVar23->uni).str = (char *)pyVar22;
    pyVar23->tag = (uVar7 & 0xff) + (uVar7 & 0xffffffffffffff00) + 0x100;
  }
LAB_00cd63fa:
  p_Var24 = (this->geometry_columns)._M_h._M_before_begin._M_nxt;
  if (p_Var24 != (_Hash_node_base *)0x0) {
    pyVar1 = &doc->val_pool;
    alc = &doc->alc;
    pyVar2 = &doc->str_pool;
    local_a0 = pyVar20;
    do {
      pyVar20 = local_a0;
      __s = p_Var24[1]._M_nxt;
      if (__s == (_Hash_node_base *)0x0 || (bool)(bVar15 ^ 1U)) {
        pyVar23 = (yyjson_mut_val *)0x0;
        local_108 = (yyjson_mut_val *)0x0;
        if (doc != (yyjson_mut_doc *)0x0) goto LAB_00cd6484;
      }
      else {
        sVar16 = strlen((char *)__s);
        pyVar23 = (doc->val_pool).cur;
        if ((doc->val_pool).end == pyVar23) {
          bVar13 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
          if (bVar13) {
            pyVar23 = pyVar1->cur;
            goto LAB_00cd6464;
          }
        }
        else {
LAB_00cd6464:
          pyVar1->cur = pyVar23 + 1;
          if (pyVar23 != (yyjson_mut_val *)0x0) {
            pyVar23->tag = sVar16 << 8 | 5;
            (pyVar23->uni).str = (char *)__s;
            goto LAB_00cd6484;
          }
        }
        pyVar23 = (yyjson_mut_val *)0x0;
LAB_00cd6484:
        local_108 = (doc->val_pool).cur;
        if ((doc->val_pool).end == local_108) {
          bVar13 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
          if (!bVar13) {
            local_108 = (yyjson_mut_val *)0x0;
            goto LAB_00cd64a9;
          }
          local_108 = pyVar1->cur;
        }
        pyVar1->cur = local_108 + 1;
        if (local_108 == (yyjson_mut_val *)0x0) {
          local_108 = (yyjson_mut_val *)0x0;
        }
        else {
          local_108->tag = 7;
        }
      }
LAB_00cd64a9:
      if ((pyVar20 == (yyjson_mut_val *)0x0) || (pyVar23 == (yyjson_mut_val *)0x0)) {
LAB_00cd65da:
        pyVar22 = (yyjson_mut_val *)0x0;
LAB_00cd65dc:
        local_108 = pyVar22;
        if (bVar15) {
LAB_00cd65e7:
          pyVar20 = (doc->val_pool).cur;
          pyVar22 = local_108;
          if ((doc->val_pool).end == pyVar20) {
            bVar13 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
            if (!bVar13) {
              pyVar20 = (yyjson_mut_val *)0x0;
              goto LAB_00cd6617;
            }
            pyVar20 = pyVar1->cur;
          }
          pyVar1->cur = pyVar20 + 1;
          if (pyVar20 == (yyjson_mut_val *)0x0) {
            pyVar20 = (yyjson_mut_val *)0x0;
          }
          else {
            pyVar20->tag = 0xe0d;
            (pyVar20->uni).f64 = (double)"geometry_types";
          }
LAB_00cd6617:
          pyVar23 = (doc->val_pool).cur;
          if ((doc->val_pool).end == pyVar23) {
            bVar13 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
            if (!bVar13) {
              pyVar23 = (yyjson_mut_val *)0x0;
              goto LAB_00cd663d;
            }
            pyVar23 = pyVar1->cur;
          }
          pyVar1->cur = pyVar23 + 1;
          if (pyVar23 == (yyjson_mut_val *)0x0) {
            pyVar23 = (yyjson_mut_val *)0x0;
          }
          else {
            pyVar23->tag = 6;
          }
        }
        else {
          pyVar20 = (yyjson_mut_val *)0x0;
          pyVar23 = (yyjson_mut_val *)0x0;
          if (doc != (yyjson_mut_doc *)0x0) goto LAB_00cd6617;
        }
LAB_00cd663d:
        if (pyVar22 == (yyjson_mut_val *)0x0) {
          bVar13 = true;
          local_108 = (yyjson_mut_val *)0x0;
          goto LAB_00cd66de;
        }
        bVar13 = false;
        local_108 = pyVar22;
        if ((((pyVar20 == (yyjson_mut_val *)0x0) || (uVar7 = pyVar22->tag, ((uint)uVar7 & 7) != 7))
            || (bVar13 = false, pyVar23 == (yyjson_mut_val *)0x0)) ||
           (((uint)pyVar20->tag & 7) != 5)) goto LAB_00cd66de;
        pyVar21 = pyVar20;
        if (0xff < uVar7) {
          lVar9 = *(long *)((pyVar22->uni).u64 + 0x10);
          pyVar21 = *(yyjson_mut_val **)(lVar9 + 0x10);
          *(yyjson_mut_val **)(lVar9 + 0x10) = pyVar20;
        }
        pyVar23->next = pyVar21;
        pyVar20->next = pyVar23;
        (pyVar22->uni).str = (char *)pyVar20;
        pyVar22->tag = (uVar7 & 0xff) + (uVar7 & 0xffffffffffffff00) + 0x100;
        bVar13 = false;
      }
      else {
        uVar7 = pyVar20->tag;
        pyVar22 = (yyjson_mut_val *)0x0;
        if (((uint)uVar7 & 7) != 7) goto LAB_00cd65dc;
        if (local_108 == (yyjson_mut_val *)0x0) goto LAB_00cd65da;
        pyVar22 = (yyjson_mut_val *)0x0;
        if (((uint)pyVar23->tag & 7) != 5) goto LAB_00cd65dc;
        pyVar22 = pyVar23;
        if (0xff < uVar7) {
          lVar9 = *(long *)((pyVar20->uni).u64 + 0x10);
          pyVar22 = *(yyjson_mut_val **)(lVar9 + 0x10);
          *(yyjson_mut_val **)(lVar9 + 0x10) = pyVar23;
        }
        local_108->next = pyVar22;
        pyVar23->next = local_108;
        (pyVar20->uni).str = (char *)pyVar23;
        pyVar20->tag = (uVar7 & 0xff) + (uVar7 & 0xffffffffffffff00) + 0x100;
        if (doc != (yyjson_mut_doc *)0x0) {
          pyVar22 = local_108;
          if ((~(uint)local_108->tag & 7) == 0) {
            pyVar20 = (doc->val_pool).cur;
            if ((ulong)(((long)(doc->val_pool).end - (long)pyVar20) / 0x18) < 2) {
              bVar13 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,2);
              if (!bVar13) goto LAB_00cd65dc;
              pyVar20 = pyVar1->cur;
            }
            pyVar1->cur = pyVar20 + 2;
            if (pyVar20 != (yyjson_mut_val *)0x0) {
              uVar7 = local_108->tag;
              pyVar20->tag = 0x80d;
              (pyVar20->uni).str = "encoding";
              pyVar20[1].tag = 0x30d;
              pyVar20[1].uni.str = "WKB";
              pyVar23 = pyVar20;
              if (0xff < uVar7) {
                lVar9 = *(long *)((local_108->uni).u64 + 0x10);
                pyVar23 = *(yyjson_mut_val **)(lVar9 + 0x10);
                *(yyjson_mut_val **)(lVar9 + 0x10) = pyVar20;
              }
              pyVar20[1].next = pyVar23;
              pyVar20->next = pyVar20 + 1;
              (local_108->uni).u64 = (uint64_t)pyVar20;
              local_108->tag = (uVar7 & 0xffffffffffffff00) + (ulong)(byte)local_108->tag + 0x100;
            }
          }
          goto LAB_00cd65dc;
        }
        if (bVar15) goto LAB_00cd65e7;
        bVar13 = false;
LAB_00cd66de:
        pyVar23 = (yyjson_mut_val *)0x0;
      }
      p_Var18 = (_Rb_tree_node_base *)p_Var24[9]._M_nxt;
      if (p_Var18 != (_Rb_tree_node_base *)(p_Var24 + 7)) {
        do {
          pcVar17 = WKBGeometryTypes::ToString((WKBGeometryType)p_Var18[1]._M_color);
          if ((pyVar23 != (yyjson_mut_val *)0x0 && doc != (yyjson_mut_doc *)0x0) &&
             ((pyVar23->tag & 7) == 6 && !(bool)(bVar15 ^ 1U))) {
            sVar16 = strlen(pcVar17);
            pyVar20 = (doc->val_pool).cur;
            if ((doc->val_pool).end == pyVar20) {
              bVar14 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
              if (!bVar14) goto LAB_00cd67ab;
              pyVar20 = pyVar1->cur;
            }
            pyVar1->cur = pyVar20 + 1;
            if (pyVar20 != (yyjson_mut_val *)0x0) {
              pyVar20->tag = sVar16 << 8 | 5;
              (pyVar20->uni).str = pcVar17;
              uVar7 = pyVar23->tag;
              if (((uint)uVar7 & 7) == 6) {
                pyVar23->tag = (uVar7 & 0xfffffffffffffffe) + 0x100;
                pyVar22 = pyVar20;
                if (0xff < uVar7) {
                  pyVar22 = *(yyjson_mut_val **)((pyVar23->uni).u64 + 0x10);
                  *(yyjson_mut_val **)((pyVar23->uni).u64 + 0x10) = pyVar20;
                }
                pyVar20->next = pyVar22;
                (pyVar23->uni).str = (char *)pyVar20;
              }
            }
          }
LAB_00cd67ab:
          p_Var18 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var18);
        } while (p_Var18 != (_Rb_tree_node_base *)(p_Var24 + 7));
      }
      if (bVar15) {
        pyVar20 = (doc->val_pool).cur;
        if ((doc->val_pool).end == pyVar20) {
          bVar14 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
          if (!bVar14) {
            pyVar20 = (yyjson_mut_val *)0x0;
            goto LAB_00cd6836;
          }
          pyVar20 = pyVar1->cur;
        }
        pyVar1->cur = pyVar20 + 1;
        if (pyVar20 == (yyjson_mut_val *)0x0) {
          pyVar20 = (yyjson_mut_val *)0x0;
        }
        else {
          pyVar20->tag = 0x40d;
          (pyVar20->uni).f64 = (double)"bbox";
        }
LAB_00cd6836:
        pyVar23 = (doc->val_pool).cur;
        if ((doc->val_pool).end == pyVar23) {
          bVar14 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
          if (!bVar14) {
            pyVar23 = (yyjson_mut_val *)0x0;
            goto LAB_00cd685b;
          }
          pyVar23 = pyVar1->cur;
        }
        pyVar1->cur = pyVar23 + 1;
        if (pyVar23 == (yyjson_mut_val *)0x0) {
          pyVar23 = (yyjson_mut_val *)0x0;
        }
        else {
          pyVar23->tag = 6;
        }
      }
      else {
        pyVar20 = (yyjson_mut_val *)0x0;
        pyVar23 = (yyjson_mut_val *)0x0;
        if (doc != (yyjson_mut_doc *)0x0) goto LAB_00cd6836;
      }
LAB_00cd685b:
      if (((!bVar13) && (pyVar20 != (yyjson_mut_val *)0x0)) &&
         ((uVar7 = local_108->tag, ((uint)uVar7 & 7) == 7 &&
          ((pyVar23 != (yyjson_mut_val *)0x0 && (((uint)pyVar20->tag & 7) == 5)))))) {
        pyVar22 = pyVar20;
        if (0xff < uVar7) {
          lVar9 = *(long *)((local_108->uni).u64 + 0x10);
          pyVar22 = *(yyjson_mut_val **)(lVar9 + 0x10);
          *(yyjson_mut_val **)(lVar9 + 0x10) = pyVar20;
        }
        pyVar23->next = pyVar22;
        pyVar20->next = pyVar23;
        (local_108->uni).str = (char *)pyVar20;
        local_108->tag = (uVar7 & 0xff) + (uVar7 & 0xffffffffffffff00) + 0x100;
        if (doc != (yyjson_mut_doc *)0x0) {
          if ((pyVar23->tag & 7) == 6) {
            yVar5 = *(yyjson_val_uni *)(p_Var24 + 0xc);
            pyVar20 = (doc->val_pool).cur;
            if ((doc->val_pool).end == pyVar20) {
              bVar14 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
              if (!bVar14) goto LAB_00cd6951;
              pyVar20 = pyVar1->cur;
            }
            pyVar1->cur = pyVar20 + 1;
            if (pyVar20 != (yyjson_mut_val *)0x0) {
              pyVar20->tag = 0x14;
              pyVar20->uni = yVar5;
              uVar7 = pyVar23->tag;
              if (((uint)uVar7 & 7) == 6) {
                pyVar23->tag = (uVar7 & 0xfffffffffffffffe) + 0x100;
                pyVar22 = pyVar20;
                if (0xff < uVar7) {
                  pyVar22 = *(yyjson_mut_val **)((pyVar23->uni).u64 + 0x10);
                  *(yyjson_mut_val **)((pyVar23->uni).u64 + 0x10) = pyVar20;
                }
                pyVar20->next = pyVar22;
                (pyVar23->uni).str = (char *)pyVar20;
              }
            }
          }
LAB_00cd6951:
          if ((pyVar23->tag & 7) == 6) {
            yVar5 = *(yyjson_val_uni *)(p_Var24 + 0xe);
            pyVar20 = (doc->val_pool).cur;
            if ((doc->val_pool).end == pyVar20) {
              bVar14 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
              if (!bVar14) goto LAB_00cd69c1;
              pyVar20 = pyVar1->cur;
            }
            pyVar1->cur = pyVar20 + 1;
            if (pyVar20 != (yyjson_mut_val *)0x0) {
              pyVar20->tag = 0x14;
              pyVar20->uni = yVar5;
              uVar7 = pyVar23->tag;
              if (((uint)uVar7 & 7) == 6) {
                pyVar23->tag = (uVar7 & 0xfffffffffffffffe) + 0x100;
                pyVar22 = pyVar20;
                if (0xff < uVar7) {
                  pyVar22 = *(yyjson_mut_val **)((pyVar23->uni).u64 + 0x10);
                  *(yyjson_mut_val **)((pyVar23->uni).u64 + 0x10) = pyVar20;
                }
                pyVar20->next = pyVar22;
                (pyVar23->uni).str = (char *)pyVar20;
              }
            }
          }
LAB_00cd69c1:
          if ((pyVar23->tag & 7) == 6) {
            yVar5 = *(yyjson_val_uni *)(p_Var24 + 0xd);
            pyVar20 = (doc->val_pool).cur;
            if ((doc->val_pool).end == pyVar20) {
              bVar14 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
              if (!bVar14) goto LAB_00cd6a31;
              pyVar20 = pyVar1->cur;
            }
            pyVar1->cur = pyVar20 + 1;
            if (pyVar20 != (yyjson_mut_val *)0x0) {
              pyVar20->tag = 0x14;
              pyVar20->uni = yVar5;
              uVar7 = pyVar23->tag;
              if (((uint)uVar7 & 7) == 6) {
                pyVar23->tag = (uVar7 & 0xfffffffffffffffe) + 0x100;
                pyVar22 = pyVar20;
                if (0xff < uVar7) {
                  pyVar22 = *(yyjson_mut_val **)((pyVar23->uni).u64 + 0x10);
                  *(yyjson_mut_val **)((pyVar23->uni).u64 + 0x10) = pyVar20;
                }
                pyVar20->next = pyVar22;
                (pyVar23->uni).str = (char *)pyVar20;
              }
            }
          }
LAB_00cd6a31:
          if ((pyVar23->tag & 7) == 6) {
            yVar5 = *(yyjson_val_uni *)(p_Var24 + 0xf);
            pyVar20 = (doc->val_pool).cur;
            if ((doc->val_pool).end == pyVar20) {
              bVar14 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
              if (!bVar14) goto LAB_00cd6aa1;
              pyVar20 = pyVar1->cur;
            }
            pyVar1->cur = pyVar20 + 1;
            if (pyVar20 != (yyjson_mut_val *)0x0) {
              pyVar20->tag = 0x14;
              pyVar20->uni = yVar5;
              uVar7 = pyVar23->tag;
              if (((uint)uVar7 & 7) == 6) {
                pyVar23->tag = (uVar7 & 0xfffffffffffffffe) + 0x100;
                pyVar22 = pyVar20;
                if (0xff < uVar7) {
                  pyVar22 = *(yyjson_mut_val **)((pyVar23->uni).u64 + 0x10);
                  *(yyjson_mut_val **)((pyVar23->uni).u64 + 0x10) = pyVar20;
                }
                pyVar20->next = pyVar22;
                (pyVar23->uni).str = (char *)pyVar20;
              }
            }
          }
        }
      }
LAB_00cd6aa1:
      if (p_Var24[0x11]._M_nxt != (_Hash_node_base *)0x0) {
        pyVar19 = duckdb_yyjson::yyjson_read_opts
                            ((char *)p_Var24[0x10]._M_nxt,(usize)p_Var24[0x11]._M_nxt,0,
                             (yyjson_alc *)0x0,(yyjson_read_err *)0x0);
        if (pyVar19 == (yyjson_doc *)0x0) {
          duckdb_yyjson::yyjson_mut_doc_free(doc);
          this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          kv._0_8_ = &kv.key._M_string_length;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&kv,"Failed to parse CRS JSON","");
          InvalidInputException::InvalidInputException(this_00,(string *)&kv);
          __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error)
          ;
        }
        pyVar20 = duckdb_yyjson::yyjson_val_mut_copy(doc,pyVar19->root);
        if (doc == (yyjson_mut_doc *)0x0) {
LAB_00cd6dcc:
          pyVar23 = (yyjson_mut_val *)0x0;
        }
        else {
          pyVar23 = (doc->val_pool).cur;
          if ((doc->val_pool).end == pyVar23) {
            bVar14 = duckdb_yyjson::unsafe_yyjson_val_pool_grow(pyVar1,alc,1);
            if (bVar14) {
              pyVar23 = pyVar1->cur;
              goto LAB_00cd6b04;
            }
            pyVar23 = (yyjson_mut_val *)0x0;
          }
          else {
LAB_00cd6b04:
            pyVar1->cur = pyVar23 + 1;
          }
          pcVar17 = (doc->str_pool).cur;
          if ((ulong)((long)(doc->str_pool).end - (long)pcVar17) < 9) {
            bVar14 = duckdb_yyjson::unsafe_yyjson_str_pool_grow(pyVar2,alc,9);
            if (!bVar14) goto LAB_00cd6dcc;
            pcVar17 = pyVar2->cur;
          }
          pyVar2->cur = pcVar17 + 9;
          if (pcVar17 != (char *)0x0) {
            builtin_strncpy(pcVar17,"projjson",9);
            if (pyVar23 != (yyjson_mut_val *)0x0) {
              pyVar23->tag = 0x80d;
              (pyVar23->uni).str = pcVar17;
              goto LAB_00cd6b55;
            }
          }
          pyVar23 = (yyjson_mut_val *)0x0;
        }
LAB_00cd6b55:
        if ((((!bVar13) && (uVar7 = local_108->tag, (~(uint)uVar7 & 7) == 0)) &&
            (pyVar23 != (yyjson_mut_val *)0x0)) &&
           ((pyVar20 != (yyjson_mut_val *)0x0 && (((uint)pyVar23->tag & 7) == 5)))) {
          pyVar22 = pyVar23;
          if (0xff < uVar7) {
            lVar9 = *(long *)((local_108->uni).u64 + 0x10);
            pyVar22 = *(yyjson_mut_val **)(lVar9 + 0x10);
            *(yyjson_mut_val **)(lVar9 + 0x10) = pyVar23;
          }
          pyVar20->next = pyVar22;
          pyVar23->next = pyVar20;
          (local_108->uni).str = (char *)pyVar23;
          local_108->tag = (uVar7 & 0xff) + (uVar7 & 0xffffffffffffff00) + 0x100;
        }
        p_Var10 = (pyVar19->alc).free;
        pvVar11 = (pyVar19->alc).ctx;
        (pyVar19->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
        (pyVar19->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
        (pyVar19->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
        (pyVar19->alc).ctx = (void *)0x0;
        if (pyVar19->str_pool != (char *)0x0) {
          (*p_Var10)(pvVar11,pyVar19->str_pool);
        }
        (*p_Var10)(pvVar11,pyVar19);
      }
      p_Var24 = p_Var24->_M_nxt;
    } while (p_Var24 != (_Hash_node_base *)0x0);
  }
  pcVar17 = duckdb_yyjson::yyjson_mut_write_opts(doc,0,(yyjson_alc *)0x0,&len,&err);
  if (pcVar17 == (char *)0x0) {
    duckdb_yyjson::yyjson_mut_doc_free(doc);
    this_01 = (SerializationException *)__cxa_allocate_exception(0x10);
    kv._0_8_ = &kv.key._M_string_length;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&kv,"Failed to write JSON string: %s","");
    SerializationException::SerializationException<char_const*>(this_01,(string *)&kv,err.msg);
    __cxa_throw(this_01,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  }
  duckdb_parquet::KeyValue::KeyValue(&kv);
  paVar4 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar4;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"geo","");
  pFVar12 = local_a8;
  duckdb_parquet::KeyValue::__set_key(&kv,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar4) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar4;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pcVar17,pcVar17 + len);
  duckdb_parquet::KeyValue::__set_value(&kv,&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar4) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  free(pcVar17);
  duckdb_yyjson::yyjson_mut_doc_free(doc);
  ::std::vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>::push_back
            (&(pFVar12->key_value_metadata).
              super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>,&kv)
  ;
  p_Var3 = &pFVar12->__isset;
  *p_Var3 = (_FileMetaData__isset)((byte)*p_Var3 | 1);
  duckdb_parquet::KeyValue::~KeyValue(&kv);
  return;
}

Assistant:

void GeoParquetFileMetadata::Write(duckdb_parquet::FileMetaData &file_meta_data) const {

	yyjson_mut_doc *doc = yyjson_mut_doc_new(nullptr);
	yyjson_mut_val *root = yyjson_mut_obj(doc);
	yyjson_mut_doc_set_root(doc, root);

	// Add the version
	yyjson_mut_obj_add_strncpy(doc, root, "version", version.c_str(), version.size());

	// Add the primary column
	yyjson_mut_obj_add_strncpy(doc, root, "primary_column", primary_geometry_column.c_str(),
	                           primary_geometry_column.size());

	// Add the columns
	const auto json_columns = yyjson_mut_obj_add_obj(doc, root, "columns");

	for (auto &column : geometry_columns) {
		const auto column_json = yyjson_mut_obj_add_obj(doc, json_columns, column.first.c_str());
		yyjson_mut_obj_add_str(doc, column_json, "encoding", "WKB");
		const auto geometry_types = yyjson_mut_obj_add_arr(doc, column_json, "geometry_types");
		for (auto &geometry_type : column.second.geometry_types) {
			const auto type_name = WKBGeometryTypes::ToString(geometry_type);
			yyjson_mut_arr_add_str(doc, geometry_types, type_name);
		}
		const auto bbox = yyjson_mut_obj_add_arr(doc, column_json, "bbox");
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.min_x);
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.min_y);
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.max_x);
		yyjson_mut_arr_add_real(doc, bbox, column.second.bbox.max_y);

		// If the CRS is present, add it
		if (!column.second.projjson.empty()) {
			const auto crs_doc = yyjson_read(column.second.projjson.c_str(), column.second.projjson.size(), 0);
			if (!crs_doc) {
				yyjson_mut_doc_free(doc);
				throw InvalidInputException("Failed to parse CRS JSON");
			}
			const auto crs_root = yyjson_doc_get_root(crs_doc);
			const auto crs_val = yyjson_val_mut_copy(doc, crs_root);
			const auto crs_key = yyjson_mut_strcpy(doc, "projjson");
			yyjson_mut_obj_add(column_json, crs_key, crs_val);
			yyjson_doc_free(crs_doc);
		}
	}

	yyjson_write_err err;
	size_t len;
	char *json = yyjson_mut_write_opts(doc, 0, nullptr, &len, &err);
	if (!json) {
		yyjson_mut_doc_free(doc);
		throw SerializationException("Failed to write JSON string: %s", err.msg);
	}

	// Create a string from the JSON
	duckdb_parquet::KeyValue kv;
	kv.__set_key("geo");
	kv.__set_value(string(json, len));

	// Free the JSON and the document
	free(json);
	yyjson_mut_doc_free(doc);

	file_meta_data.key_value_metadata.push_back(kv);
	file_meta_data.__isset.key_value_metadata = true;
}